

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::operator*(maths *this,Matrix *m,double num)

{
  double **extraout_RDX;
  Matrix MVar1;
  Matrix temp;
  Matrix local_20;
  
  Matrix::Matrix(&local_20,m);
  Matrix::operator*=(&local_20,num);
  Matrix::Matrix((Matrix *)this,&local_20);
  Matrix::~Matrix(&local_20);
  MVar1.p = extraout_RDX;
  MVar1._0_8_ = this;
  return MVar1;
}

Assistant:

Matrix operator*(const Matrix& m, double num)
{
    Matrix temp(m);
    return (temp *= num);
}